

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op_keepdims<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  byte in_DL;
  Mat *in_RSI;
  Mat *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar3;
  int j_7;
  int i_13;
  float *outptr_2;
  float *ptr_10;
  int q_8;
  int i_12;
  float *ptr_9;
  int q_7;
  int j_6;
  float *mins_ptr_3;
  int q_6;
  int j_5;
  int i_11;
  float *mins_ptr_2;
  float *ptr_8;
  int q_5;
  Mat mins_1;
  int i_10;
  float *mins_ptr_1;
  int q_4;
  int j_4;
  float sum_8;
  int i_9;
  float *mins_ptr;
  float *ptr_7;
  int q_3;
  Mat mins;
  int j_3;
  float sum_7;
  int i_8;
  float *outptr_1;
  float *ptr_6;
  int q_2;
  int i_7;
  float sum_6;
  float *outptr;
  float *ptr_5;
  int q_1;
  int i_6;
  float sum_4;
  int i_5;
  float sum_5;
  float *ptr_4;
  int q;
  Mat sums_1;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_4;
  int j_1;
  float sum_3;
  float *ptr_2;
  int i_3;
  int i_2;
  float sum_1;
  int j;
  float sum_2;
  float *ptr_1;
  int i_1;
  Mat sums;
  int h;
  int w_1;
  int i;
  float sum;
  float *ptr;
  int w;
  int dims;
  size_t elemsize;
  reduction_op_max<float> op2;
  reduction_op_max<float> op;
  Allocator *in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f8;
  float in_stack_fffffffffffff8fc;
  Mat *in_stack_fffffffffffff900;
  int iVar4;
  int in_stack_fffffffffffff908;
  int in_stack_fffffffffffff90c;
  Mat *in_stack_fffffffffffff910;
  int local_640;
  int local_63c;
  Mat local_638;
  Mat *local_5f8;
  Mat local_5f0;
  float *local_5b0;
  int local_5a8;
  int local_5a4;
  Mat local_5a0;
  float *local_560;
  int local_558;
  int local_554;
  Mat local_550;
  float *local_510;
  int local_504;
  int local_500;
  int local_4fc;
  Mat local_4f8;
  float *local_4b8;
  Mat local_4b0;
  float *local_470;
  int local_464;
  int local_41c;
  Mat local_418;
  float *local_3d8;
  int local_3d0;
  int local_3cc;
  float local_3c8;
  int local_3c4;
  Mat local_3c0;
  float *local_380;
  Mat local_378;
  float *local_338;
  int local_32c;
  int local_2e4;
  float local_2e0;
  int local_2dc;
  Mat local_2d8;
  float *local_298;
  Mat local_290;
  float *local_250;
  int local_244;
  int local_240;
  float local_23c;
  Mat local_238;
  float *local_1f8;
  Mat local_1f0;
  float *local_1b0;
  int local_1a4;
  int local_1a0;
  float local_19c;
  int local_198;
  float local_194;
  Mat local_190;
  float *local_150;
  int local_144;
  Mat local_140;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  float *local_e8;
  int local_dc;
  int local_d8;
  float local_d4;
  float *local_d0;
  int local_c8;
  int local_c4;
  float local_c0;
  int local_b0;
  float local_ac;
  float *local_a8;
  int local_a0;
  undefined4 local_9c;
  Mat local_98;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_1d = in_DL & 1;
  local_1e = in_CL & 1;
  local_1f = in_R8B & 1;
  local_38 = in_RDI->elemsize;
  local_3c = in_RDI->dims;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_3c == 1) {
    local_40 = in_RDI->w;
    Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                (size_t)in_stack_fffffffffffff900,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    local_48 = Mat::operator_cast_to_float_(local_10);
    local_4c = local_1c;
    for (local_50 = 0; fVar3 = local_4c, local_50 < local_40; local_50 = local_50 + 1) {
      local_4c = reduction_op_max<float>::operator()
                           ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                            (float *)in_stack_fffffffffffff8e8,(float *)0x1642d2);
    }
    pfVar2 = Mat::operator[](local_18,0);
    *pfVar2 = fVar3;
    return 0;
  }
  if (local_3c == 2) {
    local_54 = in_RDI->w;
    local_58 = in_RDI->h;
    if ((local_1d != 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  (size_t)in_stack_fffffffffffff900,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      Mat::Mat(in_stack_fffffffffffff900,(int)in_stack_fffffffffffff8fc,
               (size_t)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_a0 = 0; local_a0 < local_58; local_a0 = local_a0 + 1) {
          local_a8 = Mat::row(local_10,local_a0);
          local_ac = local_1c;
          for (local_b0 = 0; fVar3 = local_ac, local_b0 < local_54; local_b0 = local_b0 + 1) {
            local_ac = reduction_op_max<float>::operator()
                                 ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                  (float *)in_stack_fffffffffffff8e8,(float *)0x16448b);
          }
          pfVar2 = Mat::operator[](&local_98,(long)local_a0);
          *pfVar2 = fVar3;
        }
        local_c0 = local_1c;
        for (local_c4 = 0; fVar3 = local_c0, local_c4 < local_58; local_c4 = local_c4 + 1) {
          Mat::operator[](&local_98,(long)local_c4);
          local_c0 = reduction_op_max<float>::operator()
                               ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                (float *)in_stack_fffffffffffff8e8,(float *)0x164585);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x164608);
      return local_4;
    }
    if ((local_1d != 0) && (local_1e == 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  (size_t)in_stack_fffffffffffff900,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      for (local_c8 = 0; local_c8 < local_58; local_c8 = local_c8 + 1) {
        local_d0 = Mat::row(local_10,local_c8);
        local_d4 = local_1c;
        for (local_d8 = 0; fVar3 = local_d4, local_d8 < local_54; local_d8 = local_d8 + 1) {
          local_d4 = reduction_op_max<float>::operator()
                               ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                (float *)in_stack_fffffffffffff8e8,(float *)0x1646ea);
        }
        pfVar2 = Mat::operator[](local_18,(long)local_c8);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if ((local_1d == 0) && (local_1e != 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  (size_t)in_stack_fffffffffffff900,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
      for (local_dc = 0; local_dc < local_58; local_dc = local_dc + 1) {
        local_e8 = Mat::row(local_10,local_dc);
        for (local_ec = 0; local_ec < local_54; local_ec = local_ec + 1) {
          Mat::operator[](local_18,(long)local_ec);
          fVar3 = reduction_op_max<float>::operator()
                            ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                             (float *)in_stack_fffffffffffff8e8,(float *)0x164851);
          pfVar2 = Mat::operator[](local_18,(long)local_ec);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
  }
  if (local_3c == 3) {
    local_f0 = in_RDI->w;
    local_f4 = in_RDI->h;
    local_f8 = in_RDI->c;
    local_fc = local_f0 * local_f4;
    iVar4 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      Mat::Mat(in_stack_fffffffffffff900,(int)in_stack_fffffffffffff8fc,
               (size_t)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_144 = 0; local_144 < local_f8; local_144 = local_144 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_190);
          Mat::~Mat((Mat *)0x164a1f);
          local_194 = local_1c;
          local_150 = pfVar2;
          for (local_198 = 0; fVar3 = local_194, local_198 < local_fc; local_198 = local_198 + 1) {
            local_194 = reduction_op_max<float>::operator()
                                  ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                   (float *)in_stack_fffffffffffff8e8,(float *)0x164a85);
          }
          pfVar2 = Mat::operator[](&local_140,(long)local_144);
          *pfVar2 = fVar3;
        }
        local_19c = local_1c;
        for (local_1a0 = 0; fVar3 = local_19c, local_1a0 < local_f8; local_1a0 = local_1a0 + 1) {
          Mat::operator[](&local_140,(long)local_1a0);
          local_19c = reduction_op_max<float>::operator()
                                ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                 (float *)in_stack_fffffffffffff8e8,(float *)0x164b7f);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x164c02);
      return local_4;
    }
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      for (local_1a4 = 0; local_1a4 < local_f8; local_1a4 = local_1a4 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1f0);
        Mat::~Mat((Mat *)0x164cbd);
        local_1b0 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_238);
        Mat::~Mat((Mat *)0x164d0b);
        local_23c = local_1c;
        local_1f8 = pfVar2;
        for (local_240 = 0; local_240 < local_fc; local_240 = local_240 + 1) {
          local_23c = reduction_op_max<float>::operator()
                                ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                 (float *)in_stack_fffffffffffff8e8,(float *)0x164d74);
        }
        *local_1f8 = local_23c;
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      for (local_244 = 0; local_244 < local_f8; local_244 = local_244 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_290);
        Mat::~Mat((Mat *)0x164e86);
        local_250 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2d8);
        Mat::~Mat((Mat *)0x164ed4);
        local_298 = pfVar2;
        for (local_2dc = 0; local_2dc < local_f4; local_2dc = local_2dc + 1) {
          local_2e0 = local_1c;
          for (local_2e4 = 0; local_2e4 < local_f0; local_2e4 = local_2e4 + 1) {
            local_2e0 = reduction_op_max<float>::operator()
                                  ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                   (float *)in_stack_fffffffffffff8e8,(float *)0x164f5c);
          }
          local_298[local_2dc] = local_2e0;
          local_250 = local_250 + local_f0;
        }
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      Mat::Mat(in_stack_fffffffffffff900,(int)in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
               (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),(size_t)in_stack_fffffffffffff8e8,
               (Allocator *)0x165082);
      bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
        for (local_32c = 0; local_32c < local_f8; local_32c = local_32c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_378);
          Mat::~Mat((Mat *)0x165124);
          local_338 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_3c0);
          Mat::~Mat((Mat *)0x16516e);
          local_380 = pfVar2;
          for (local_3c4 = 0; local_3c4 < local_f4; local_3c4 = local_3c4 + 1) {
            local_3c8 = local_1c;
            for (local_3cc = 0; local_3cc < local_f0; local_3cc = local_3cc + 1) {
              local_3c8 = reduction_op_max<float>::operator()
                                    ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                     (float *)in_stack_fffffffffffff8e8,(float *)0x1651f0);
            }
            local_380[local_3c4] = local_3c8;
            local_338 = local_338 + local_f0;
          }
        }
        Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
        for (local_3d0 = 0; local_3d0 < local_f8; local_3d0 = local_3d0 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_418);
          Mat::~Mat((Mat *)0x16531f);
          local_3d8 = pfVar2;
          for (local_41c = 0; local_41c < local_f4; local_41c = local_41c + 1) {
            Mat::operator[](local_18,(long)local_41c);
            fVar3 = reduction_op_max<float>::operator()
                              ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                               (float *)in_stack_fffffffffffff8e8,(float *)0x165380);
            pfVar2 = Mat::operator[](local_18,(long)local_41c);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x1653f8);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      Mat::Mat(in_stack_fffffffffffff900,(int)in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,
               (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),(size_t)in_stack_fffffffffffff8e8,
               (Allocator *)0x16548a);
      bVar1 = Mat::empty(in_stack_fffffffffffff8f0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
        for (local_464 = 0; local_464 < local_f8; local_464 = local_464 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_4b0);
          Mat::~Mat((Mat *)0x16552c);
          local_470 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_4f8);
          Mat::~Mat((Mat *)0x165576);
          local_4b8 = pfVar2;
          for (local_4fc = 0; local_4fc < local_f4; local_4fc = local_4fc + 1) {
            for (local_500 = 0; local_500 < local_f0; local_500 = local_500 + 1) {
              fVar3 = reduction_op_max<float>::operator()
                                ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                                 (float *)in_stack_fffffffffffff8e8,(float *)0x1655ee);
              local_4b8[local_500] = fVar3;
            }
            local_470 = local_470 + local_f0;
          }
        }
        Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
        for (local_504 = 0; local_504 < local_f8; local_504 = local_504 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                       (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_550);
          Mat::~Mat((Mat *)0x16570b);
          local_510 = pfVar2;
          for (local_554 = 0; local_554 < local_f0; local_554 = local_554 + 1) {
            Mat::operator[](local_18,(long)local_554);
            fVar3 = reduction_op_max<float>::operator()
                              ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                               (float *)in_stack_fffffffffffff8e8,(float *)0x16576c);
            pfVar2 = Mat::operator[](local_18,(long)local_554);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_9c = 1;
      Mat::~Mat((Mat *)0x1657e4);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
      for (local_558 = 0; local_558 < local_f8; local_558 = local_558 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_5a0);
        Mat::~Mat((Mat *)0x1658b7);
        local_560 = pfVar2;
        for (local_5a4 = 0; local_5a4 < local_fc; local_5a4 = local_5a4 + 1) {
          Mat::operator[](local_18,(long)local_5a4);
          in_stack_fffffffffffff8fc =
               reduction_op_max<float>::operator()
                         ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,
                          (float *)in_stack_fffffffffffff8e8,(float *)0x16591b);
          pfVar2 = Mat::operator[](local_18,(long)local_5a4);
          *pfVar2 = in_stack_fffffffffffff8fc;
        }
      }
      return 0;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create(in_stack_fffffffffffff910,in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                  iVar4,CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                  (Allocator *)in_stack_fffffffffffff8f0);
      Mat::fill(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
      for (local_5a8 = 0; iVar4 = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
          local_5a8 < local_f8; local_5a8 = local_5a8 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),iVar4);
        pfVar2 = Mat::operator_cast_to_float_(&local_5f0);
        Mat::~Mat((Mat *)0x165a4b);
        local_5b0 = pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),iVar4);
        in_stack_fffffffffffff8f0 = (Mat *)Mat::operator_cast_to_float_(&local_638);
        Mat::~Mat((Mat *)0x165a92);
        local_5f8 = in_stack_fffffffffffff8f0;
        for (local_63c = 0; local_63c < local_f4; local_63c = local_63c + 1) {
          for (local_640 = 0; local_640 < local_f0; local_640 = local_640 + 1) {
            fVar3 = reduction_op_max<float>::operator()
                              ((reduction_op_max<float> *)in_stack_fffffffffffff8f0,pfVar2,
                               (float *)0x165b14);
            *(float *)((long)&local_5f8->data + (long)local_640 * 4) = fVar3;
          }
          local_5b0 = local_5b0 + local_f0;
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}